

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

int __thiscall serial::Serial::SerialImpl::close(SerialImpl *this,int __fd)

{
  int in_EAX;
  int iVar1;
  IOException *this_00;
  int *piVar2;
  string local_40;
  
  if (this->is_open_ == true) {
    if (this->fd_ != -1) {
      iVar1 = ::close(this->fd_);
      if (iVar1 != 0) {
        this_00 = (IOException *)__cxa_allocate_exception(0x78);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                   ,"");
        piVar2 = __errno_location();
        IOException::IOException(this_00,&local_40,0x1d3,*piVar2);
        __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
      }
      this->fd_ = -1;
      in_EAX = 0;
    }
    this->is_open_ = false;
  }
  return in_EAX;
}

Assistant:

void
Serial::SerialImpl::close ()
{
  if (is_open_ == true) {
    if (fd_ != -1) {
      int ret;
      ret = ::close (fd_);
      if (ret == 0) {
        fd_ = -1;
      } else {
        THROW (IOException, errno);
      }
    }
    is_open_ = false;
  }
}